

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseResolver<(anonymous_namespace)::Enum2>::
reject<std::__exception_ptr::exception_ptr>
          (PromiseResolver<(anonymous_namespace)::Enum2> *this,exception_ptr *error)

{
  QPromise<(anonymous_namespace)::Enum2> *pQVar1;
  PromiseData<(anonymous_namespace)::Enum2> *this_00;
  void *pvVar2;
  void *__tmp;
  Data *pDVar3;
  
  pQVar1 = ((this->m_d).d)->promise;
  if (pQVar1 != (QPromise<(anonymous_namespace)::Enum2> *)0x0) {
    this_00 = (pQVar1->super_QPromiseBase<(anonymous_namespace)::Enum2>).m_d.d;
    if (error == (exception_ptr *)0x0) {
      error = (exception_ptr *)0x0;
    }
    else {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    pvVar2 = (this_00->
             super_PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
             ).m_error.m_data._M_exception_object;
    (this_00->
    super_PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
    ).m_error.m_data._M_exception_object = error;
    if (pvVar2 != (void *)0x0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>::
    setSettled(&this_00->
                super_PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
              );
    PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>::
    dispatch(&((pQVar1->super_QPromiseBase<(anonymous_namespace)::Enum2>).m_d.d)->
              super_PromiseDataBase<(anonymous_namespace)::Enum2,_void_(const_(anonymous_namespace)::Enum2_&)>
            );
    pDVar3 = (this->m_d).d;
    if (pDVar3->promise != (QPromise<(anonymous_namespace)::Enum2> *)0x0) {
      (*(pDVar3->promise->super_QPromiseBase<(anonymous_namespace)::Enum2>)._vptr_QPromiseBase[1])()
      ;
      pDVar3 = (this->m_d).d;
    }
    pDVar3->promise = (QPromise<(anonymous_namespace)::Enum2> *)0x0;
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }